

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_strval(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint in_EAX;
  char *zString;
  int iLen;
  undefined8 uStack_18;
  
  if (nArg < 1) {
    jx9MemObjRelease(pCtx->pRet);
  }
  else {
    uStack_18 = (ulong)in_EAX;
    zString = jx9_value_to_string(*apArg,(int *)((long)&uStack_18 + 4));
    jx9_value_string(pCtx->pRet,zString,uStack_18._4_4_);
  }
  return 0;
}

Assistant:

static int jx9Builtin_strval(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	if( nArg < 1 ){
		/* return NULL */
		jx9_result_null(pCtx);
	}else{
		const char *zVal;
		int iLen = 0; /* cc -O6 warning */
		/* Perform the cast */
		zVal = jx9_value_to_string(apArg[0], &iLen);
		jx9_result_string(pCtx, zVal, iLen);
	}
	return JX9_OK;
}